

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Performance::anon_unknown_0::RenderCountCase::logAnalysis
          (RenderCountCase *this,
          vector<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
          *samples)

{
  ostringstream *poVar1;
  TestLog *this_00;
  pointer pSVar2;
  long lVar3;
  long lVar4;
  size_t ndx;
  size_t __n;
  int precision;
  void *__buf;
  void *__buf_00;
  allocator<char> local_212;
  allocator<char> local_211;
  float local_210;
  LineParametersWithConfidence testParam;
  string local_1f0;
  string local_1d0;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> testSamples;
  undefined1 local_198 [384];
  
  this_00 = ((this->super_BaseCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
            (&testSamples,
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)local_198);
  lVar4 = 4;
  for (__n = 0; pSVar2 = (samples->
                         super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
                         )._M_impl.super__Vector_impl_data._M_start,
      __n < (ulong)((long)(samples->
                          super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar2 >> 5);
      __n = __n + 1) {
    lVar3 = *(long *)((long)&pSVar2->nullTime + lVar4 * 4);
    *(float *)((long)(testSamples.
                      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar4 + -4) =
         (float)*(int *)((long)&pSVar2->baseTime + lVar4 * 4 + 4);
    *(float *)((long)(testSamples.
                      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar4) = (float)lVar3;
    lVar4 = lVar4 + 8;
  }
  deqp::gls::theilSenSiegelLinearRegression(&testParam,&testSamples,0.6);
  local_210 = 262144.0 / testParam.coefficient;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,"Linear Regression",&local_211);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"Linear Regression",&local_212);
  tcu::LogSection::LogSection((LogSection *)local_198,&local_1f0,&local_1d0);
  tcu::LogSection::write((LogSection *)local_198,(int)this_00,__buf,__n);
  tcu::LogSection::~LogSection((LogSection *)local_198);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  poVar1 = (ostringstream *)(local_198 + 8);
  local_198._0_8_ = this_00;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,
                  "Offset & coefficient presented as [confidence interval min, estimate, confidence interval max]. Reported confidence interval for this test is "
                 );
  std::ostream::operator<<(poVar1,0.6);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  poVar1 = (ostringstream *)(local_198 + 8);
  local_198._0_8_ = this_00;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Render time for scene with depth test was\n\t");
  std::operator<<((ostream *)poVar1,"[");
  std::ostream::operator<<(poVar1,testParam.offsetConfidenceLower);
  std::operator<<((ostream *)poVar1,", ");
  std::ostream::operator<<(poVar1,testParam.offset);
  std::operator<<((ostream *)poVar1,", ");
  std::ostream::operator<<(poVar1,testParam.offsetConfidenceUpper);
  std::operator<<((ostream *)poVar1,"]us +");
  std::operator<<((ostream *)poVar1,"[");
  std::ostream::operator<<(poVar1,testParam.coefficientConfidenceLower);
  std::operator<<((ostream *)poVar1,", ");
  std::ostream::operator<<(poVar1,testParam.coefficient);
  std::operator<<((ostream *)poVar1,", ");
  std::ostream::operator<<(poVar1,testParam.coefficientConfidenceUpper);
  std::operator<<((ostream *)poVar1,"]");
  std::operator<<((ostream *)poVar1,"us/workload");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  tcu::TestLog::endSection(this_00);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"Result",&local_211);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"Result",&local_212);
  tcu::LogSection::LogSection((LogSection *)local_198,&local_1f0,&local_1d0);
  tcu::LogSection::write((LogSection *)local_198,(int)this_00,__buf_00,__n);
  tcu::LogSection::~LogSection((LogSection *)local_198);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  if (0.0 <= testParam.coefficientConfidenceLower) {
    poVar1 = (ostringstream *)(local_198 + 8);
    if (testParam.coefficientConfidenceUpper * 0.25 <= testParam.coefficientConfidenceLower) {
      local_198._0_8_ = this_00;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Culled hidden pixels @ ");
      std::ostream::operator<<(poVar1,local_210);
      std::operator<<((ostream *)poVar1,"Mpx/s");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      de::floatToString_abi_cxx11_((string *)local_198,(de *)0x2,local_210,precision);
      tcu::ResultCollector::addResult
                (&(this->super_BaseCase).m_results,QP_TEST_RESULT_PASS,(string *)local_198);
    }
    else {
      local_198._0_8_ = this_00;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,
                      "Coefficient confidence range is extremely large, cannot give reliable result"
                     );
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_198,"Result confidence extremely low",(allocator<char> *)&local_1f0
                );
      tcu::ResultCollector::addResult
                (&(this->super_BaseCase).m_results,QP_TEST_RESULT_PASS,(string *)local_198);
    }
  }
  else {
    poVar1 = (ostringstream *)(local_198 + 8);
    local_198._0_8_ = this_00;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "Coefficient confidence bounds include values below 0.0, the operation likely has neglible per-pixel cost"
                   );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_198,"Pass",(allocator<char> *)&local_1f0);
    tcu::ResultCollector::addResult
              (&(this->super_BaseCase).m_results,QP_TEST_RESULT_PASS,(string *)local_198);
  }
  std::__cxx11::string::~string((string *)local_198);
  tcu::TestLog::endSection(this_00);
  std::_Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::~_Vector_base
            (&testSamples.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>);
  return;
}

Assistant:

void RenderCountCase::logAnalysis (const vector<Sample>& samples)
{
	using namespace gls;

	TestLog&		log			= m_testCtx.getLog();
	int				maxWorkload	= 0;
	vector<Vec2>	testSamples	(samples.size());

	for (size_t ndx = 0; ndx < samples.size(); ndx++)
	{
		const Sample& sample = samples[ndx];

		testSamples[ndx] = Vec2((float)sample.workload, (float)sample.testTime);

		maxWorkload = de::max(maxWorkload, sample.workload);
	}

	{
		const float							confidence	= 0.60f;
		const LineParametersWithConfidence	testParam	= theilSenSiegelLinearRegression(testSamples, confidence);
		const float							usPerCall	= testParam.coefficient;
		const float							pxPerCall	= RENDER_SIZE*RENDER_SIZE;
		const float							pxPerUs		= pxPerCall/usPerCall;
		const float							mpxPerS		= pxPerUs;

		log << TestLog::Section("Linear Regression", "Linear Regression");
		log << TestLog::Message << "Offset & coefficient presented as [confidence interval min, estimate, confidence interval max]. Reported confidence interval for this test is " << confidence << TestLog::EndMessage;
		log << TestLog::Message << "Render time for scene with depth test was\n\t"
			<< "[" << testParam.offsetConfidenceLower << ", " << testParam.offset <<  ", " << testParam.offsetConfidenceUpper << "]us +"
			<< "[" << testParam.coefficientConfidenceLower << ", " << testParam.coefficient << ", " << testParam.coefficientConfidenceUpper << "]"
			<< "us/workload" << TestLog::EndMessage;
		log << TestLog::EndSection;

		log << TestLog::Section("Result", "Result");

		if (testParam.coefficientConfidenceLower < 0.0f)
		{
			log << TestLog::Message << "Coefficient confidence bounds include values below 0.0, the operation likely has neglible per-pixel cost" << TestLog::EndMessage;
			m_results.addResult(QP_TEST_RESULT_PASS, "Pass");
		}
		else if (testParam.coefficientConfidenceLower < testParam.coefficientConfidenceUpper*0.25)
		{
			log << TestLog::Message << "Coefficient confidence range is extremely large, cannot give reliable result" << TestLog::EndMessage;
			m_results.addResult(QP_TEST_RESULT_PASS, "Result confidence extremely low");
		}
		else
		{
			log << TestLog::Message << "Culled hidden pixels @ " << mpxPerS << "Mpx/s" << TestLog::EndMessage;
			m_results.addResult(QP_TEST_RESULT_PASS, de::floatToString(mpxPerS, 2));
		}

		log << TestLog::EndSection;
	}
}